

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O0

void __thiscall IContactList::AddContact(IContactList *this,char *pName,char *pClan)

{
  uint uVar1;
  uint uVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  int i;
  uint ClanHash;
  uint NameHash;
  int local_24;
  char *src;
  
  if ((*(int *)(in_RDI + 0x3e08) != 0x80) && ((*in_RSI != '\0' || (*in_RDX != '\0')))) {
    src = in_RDI;
    uVar1 = str_quickhash(in_RSI);
    uVar2 = str_quickhash(in_RDX);
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x3e08); local_24 = local_24 + 1) {
      if ((*(uint *)(in_RDI + (long)local_24 * 0x7c + 0x7c) == uVar1) &&
         (*(uint *)(in_RDI + (long)local_24 * 0x7c + 0x80) == uVar2)) {
        return;
      }
    }
    str_utf8_copy_num(unaff_retaddr,src,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    str_utf8_copy_num(unaff_retaddr,src,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    *(uint *)(in_RDI + (long)*(int *)(in_RDI + 0x3e08) * 0x7c + 0x7c) = uVar1;
    *(uint *)(in_RDI + (long)*(int *)(in_RDI + 0x3e08) * 0x7c + 0x80) = uVar2;
    *(int *)(in_RDI + 0x3e08) = *(int *)(in_RDI + 0x3e08) + 1;
  }
  return;
}

Assistant:

void IContactList::AddContact(const char *pName, const char *pClan)
{
	if(m_NumContacts == CContactInfo::MAX_CONTACTS || (pName[0] == 0 && pClan[0] == 0))
		return;

	// make sure we don't have the friend already
	unsigned NameHash = str_quickhash(pName);
	unsigned ClanHash = str_quickhash(pClan);
	for(int i = 0; i < m_NumContacts; ++i)
	{
		if(m_aContacts[i].m_NameHash == NameHash && m_aContacts[i].m_ClanHash == ClanHash)
			return;
	}

	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aName, pName, sizeof(m_aContacts[m_NumContacts].m_aName), MAX_NAME_LENGTH);
	str_utf8_copy_num(m_aContacts[m_NumContacts].m_aClan, pClan, sizeof(m_aContacts[m_NumContacts].m_aClan), MAX_CLAN_LENGTH);
	m_aContacts[m_NumContacts].m_NameHash = NameHash;
	m_aContacts[m_NumContacts].m_ClanHash = ClanHash;
	++m_NumContacts;
}